

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

SetUpTearDownSuiteFuncType
testing::internal::SuiteApiResolver<base_iterator_matrix_sparse_element_test>::GetSetUpCaseOrSuite
          (char *filename,int line_num)

{
  bool bVar1;
  size_t sVar2;
  GTestLog local_1c;
  
  bVar1 = IsTrue(true);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x20e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x164530);
    }
    else {
      sVar2 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,line_num);
    GTestLog::~GTestLog(&local_1c);
  }
  return (SetUpTearDownSuiteFuncType)0x0;
}

Assistant:

static SetUpTearDownSuiteFuncType GetSetUpCaseOrSuite(const char* filename,
                                                        int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::SetUpTestCase, &Test::SetUpTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::SetUpTestSuite, &Test::SetUpTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both SetUpTestSuite and SetUpTestCase, please "
           "make sure there is only one present at "
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::SetUpTestSuite;
#endif
  }